

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O0

bool __thiscall Js::AsmJsType::isSubType(AsmJsType *this,AsmJsType type)

{
  AsmJsType *this_local;
  AsmJsType type_local;
  
  switch(type.which_) {
  case Int:
    this_local._7_1_ = isInt(this);
    break;
  default:
    this_local._7_1_ = false;
    break;
  case Double:
    this_local._7_1_ = isDouble(this);
    break;
  case Float:
    this_local._7_1_ = isFloat(this);
    break;
  case MaybeDouble:
    this_local._7_1_ = isMaybeDouble(this);
    break;
  case DoubleLit:
    this_local._7_1_ = isDoubleLit(this);
    break;
  case MaybeFloat:
    this_local._7_1_ = isMaybeFloat(this);
    break;
  case Floatish:
    this_local._7_1_ = isFloatish(this);
    break;
  case FloatishDoubleLit:
    this_local._7_1_ = isFloatishDoubleLit(this);
    break;
  case Fixnum:
    this_local._7_1_ = this->which_ == Fixnum;
    break;
  case Signed:
    this_local._7_1_ = isSigned(this);
    break;
  case Unsigned:
    this_local._7_1_ = isUnsigned(this);
    break;
  case Intish:
    this_local._7_1_ = isIntish(this);
    break;
  case Void:
    this_local._7_1_ = isVoid(this);
  }
  return this_local._7_1_;
}

Assistant:

bool AsmJsType::isSubType(AsmJsType type) const
    {
        switch (type.which_)
        {
        case Js::AsmJsType::Double:
            return isDouble();
            break;

        case Js::AsmJsType::MaybeDouble:
            return isMaybeDouble();
            break;
        case Js::AsmJsType::DoubleLit:
            return isDoubleLit();
            break;
        case Js::AsmJsType::Float:
            return isFloat();
            break;
        case Js::AsmJsType::MaybeFloat:
            return isMaybeFloat();
            break;
        case Js::AsmJsType::Floatish:
            return isFloatish();
            break;
        case Js::AsmJsType::FloatishDoubleLit:
            return isFloatishDoubleLit();
            break;
        case Js::AsmJsType::Fixnum:
            return which_ == Fixnum;
            break;
        case Js::AsmJsType::Int:
            return isInt();
            break;
        case Js::AsmJsType::Signed:
            return isSigned();
            break;
        case Js::AsmJsType::Unsigned:
            return isUnsigned();
            break;
        case Js::AsmJsType::Intish:
            return isIntish();
            break;
        case Js::AsmJsType::Void:
            return isVoid();
            break;
        default:
            break;
        }
        return false;
    }